

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Check
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool expectFull,bool expectPending
          )

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  char *message;
  char *error;
  undefined4 *puVar5;
  uint lineNumber;
  undefined8 *in_FS_OFFSET;
  
  if (this->freeObjectList == this->lastFreeObjectHead) {
    CheckFreeBitVector(this,false);
  }
  else {
    CheckDebugFreeBitVector(this,false);
  }
  uVar3 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar3 < 0xb) && ((0x528U >> (uVar3 & 0x1f) & 1) != 0)) {
    pSVar4 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock);
    if ((pSVar4->disposedObjectList != (FreeObject *)0x0 || pSVar4->pendingDisposeCount != 0) !=
        expectPending) {
LAB_0020e6ce:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)*in_FS_OFFSET;
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x6bf,"(expectPending == HasAnyDisposeObjects())",
                         "expectPending == HasAnyDisposeObjects()");
      if (!bVar2) goto LAB_0020e83b;
      *puVar5 = 0;
    }
  }
  else if (expectPending) goto LAB_0020e6ce;
  if ((this->isInAllocator == false) && (this->isClearedFromAllocator != true)) {
    bVar2 = false;
    if (this->freeObjectList == (FreeObject *)0x0) {
      bVar2 = true;
      uVar3 = (uint)(this->super_HeapBlock).heapBlockType;
      if ((uVar3 < 0xb) && ((0x528U >> (uVar3 & 0x1f) & 1) != 0)) {
        pSVar4 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                           (&this->super_HeapBlock);
        bVar2 = pSVar4->disposedObjectList == (FreeObject *)0x0 && pSVar4->pendingDisposeCount == 0;
      }
    }
    if (bVar2 == expectFull) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    error = "(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()))";
    message = "expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects())";
    lineNumber = 0x6cc;
  }
  else {
    if (expectFull && !expectPending) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)*in_FS_OFFSET;
    *puVar5 = 1;
    error = "(expectFull && !expectPending)";
    message = "expectFull && !expectPending";
    lineNumber = 0x6c8;
  }
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                     ,lineNumber,error,message);
  if (bVar2) {
    *puVar5 = 0;
    return;
  }
LAB_0020e83b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::Check(bool expectFull, bool expectPending)
{
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    // If we allocated from this block during the concurrent sweep the free bit vectors would be invalid.
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
    if (!this->wasAllocatedFromDuringSweep)
#endif
#endif
    {
        if (this->IsFreeBitsValid())
        {
            CheckFreeBitVector(false);
        }
        else
        {
            CheckDebugFreeBitVector(false);
        }
    }

    Assert(expectPending == HasAnyDisposeObjects());

    // As the blocks are added to the SLIST and used from there during concurrent sweep, the expectFull assertion doesn't hold anymore.
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    if (!CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc))
#endif
    {
        if (this->isInAllocator || this->isClearedFromAllocator)
        {
            Assert(expectFull && !expectPending);
        }
        else
        {
            Assert(expectFull == (!this->HasFreeObject() && !HasAnyDisposeObjects()));
        }
    }
}